

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

SequenceCatalogEntry *
duckdb::BindSequence(Binder *binder,string *catalog,string *schema,string *name)

{
  SequenceCatalogEntry *pSVar1;
  optional_ptr<duckdb::CatalogEntry,_true> local_50;
  EntryLookupInfo sequence_lookup;
  
  Binder::BindSchemaOrCatalog(binder->context,catalog,schema);
  EntryLookupInfo::EntryLookupInfo
            (&sequence_lookup,SEQUENCE_ENTRY,name,(QueryErrorContext)0xffffffffffffffff);
  local_50 = CatalogEntryRetriever::GetEntry
                       (&binder->entry_retriever,catalog,schema,&sequence_lookup,THROW_EXCEPTION);
  pSVar1 = (SequenceCatalogEntry *)optional_ptr<duckdb::CatalogEntry,_true>::operator->(&local_50);
  return pSVar1;
}

Assistant:

SequenceCatalogEntry &BindSequence(Binder &binder, string &catalog, string &schema, const string &name) {
	// fetch the sequence from the catalog
	Binder::BindSchemaOrCatalog(binder.context, catalog, schema);
	EntryLookupInfo sequence_lookup(CatalogType::SEQUENCE_ENTRY, name);
	return binder.EntryRetriever().GetEntry(catalog, schema, sequence_lookup)->Cast<SequenceCatalogEntry>();
}